

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall
spoa::Graph::AddAlignment
          (Graph *this,Alignment *alignment,char *sequence,uint32_t sequence_len,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *weights)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint32_t code;
  pointer piVar4;
  pointer piVar5;
  pointer ppVar6;
  pointer puVar7;
  Node **ppNVar8;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *p_Var9;
  Node *head;
  __uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> _Var10;
  invalid_argument *piVar11;
  long *plVar12;
  uint32_t i;
  ulong uVar13;
  int *__args;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *weights_00;
  Node **kt;
  Node *tail;
  Node *pNVar14;
  Node **__args_00;
  pointer ppVar15;
  Node *curr;
  pointer local_78;
  pointer jt;
  Node *begin;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid;
  
  if (sequence_len != 0) {
    if ((long)(weights->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(weights->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)sequence_len) {
      piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar11,
                 "[spoa::Graph::AddAlignment] error: sequence and weights are of unequal size!");
      __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    piVar4 = (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar13 = 0; sequence_len != uVar13; uVar13 = uVar13 + 1) {
      if (piVar4[sequence[uVar13]] == -1) {
        uVar2 = this->num_codes_;
        piVar4[sequence[uVar13]] = uVar2;
        cVar1 = sequence[uVar13];
        this->num_codes_ = uVar2 + 1;
        piVar5[uVar2] = (int)cVar1;
      }
    }
    ppVar15 = (alignment->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (alignment->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if (ppVar15 == ppVar6) {
      valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = &AddSequence(this,sequence,weights,0,sequence_len)->id;
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&this->sequences_,
                 (Node **)&valid);
      TopologicalSort(this);
    }
    else {
      valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78 = (pointer)alignment;
      local_60 = weights;
      for (__args = &ppVar15->second; weights_00 = local_60, (pointer)(__args + -1) != ppVar6;
          __args = __args + 2) {
        iVar3 = *__args;
        if (iVar3 != -1) {
          if ((iVar3 < 0) || ((int)sequence_len <= iVar3)) {
            piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar11,"[spoa::Graph::AddAlignment] error: invalid alignment");
            __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&valid,__args);
        }
      }
      if (valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar11,"[spoa::Graph::AddAlignment] error: missing sequence in alignment");
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      begin = AddSequence(this,sequence,local_60,0,
                          *valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start);
      if (begin == (Node *)0x0) {
        tail = (Node *)0x0;
      }
      else {
        tail = (this->nodes_).
               super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
               _M_t.
               super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
               super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
      }
      head = AddSequence(this,sequence,weights_00,
                         valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1] + 1,sequence_len);
      p_Var9 = (_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &local_78->first;
      local_78 = (((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  &local_78->first)->_M_impl).super__Vector_impl_data._M_finish;
      for (ppVar15 = (p_Var9->_M_impl).super__Vector_impl_data._M_start; ppVar15 != local_78;
          ppVar15 = ppVar15 + 1) {
        pNVar14 = tail;
        if ((long)ppVar15->second != -1) {
          code = (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[sequence[ppVar15->second]];
          curr = (Node *)0x0;
          if ((long)ppVar15->first == -1) {
            _Var10._M_t.
            super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
            super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl =
                 (tuple<spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>)
                 AddNode(this,code);
          }
          else {
            jt = *(pointer *)
                  &(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[ppVar15->first]._M_t.
                   super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                   ._M_t;
            _Var10._M_t.
            super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
            super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl =
                 (tuple<spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>)
                 (tuple<spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>)jt;
            if (*(uint32_t *)((long)jt + 4) != code) {
              plVar12 = *(long **)((long)jt + 0x38);
LAB_00110e2e:
              if (plVar12 != *(long **)((long)jt + 0x40)) goto code_r0x00110e33;
              curr = AddNode(this,code);
              ppNVar8 = (jt->aligned_nodes).
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (__args_00 = (jt->aligned_nodes).
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start; __args_00 != ppNVar8;
                  __args_00 = __args_00 + 1) {
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &(*__args_00)->aligned_nodes,&curr);
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*const&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &curr->aligned_nodes,__args_00);
              }
              std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
              emplace_back<spoa::Graph::Node*&>
                        ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                         &jt->aligned_nodes,&curr);
              std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
              emplace_back<spoa::Graph::Node*&>
                        ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                         &curr->aligned_nodes,&jt);
              weights_00 = local_60;
              _Var10._M_t.
              super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
              super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl =
                   (tuple<spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>)
                   (tuple<spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>)curr;
            }
          }
LAB_00110e4e:
          curr = (Node *)_Var10._M_t.
                         super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                         .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
          if (begin == (Node *)0x0) {
            begin = curr;
          }
          pNVar14 = curr;
          if (tail != (Node *)0x0) {
            puVar7 = (weights_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            AddEdge(this,tail,curr,puVar7[ppVar15->second] + puVar7[(long)ppVar15->second + -1]);
            pNVar14 = curr;
          }
        }
        tail = pNVar14;
      }
      if (head != (Node *)0x0) {
        puVar7 = (weights_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        AddEdge(this,tail,head,
                puVar7[valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_finish[-1] + 1] +
                puVar7[valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_finish[-1]]);
      }
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*&>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&this->sequences_,
                 &begin);
      TopologicalSort(this);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  return;
code_r0x00110e33:
  _Var10._M_t.super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
  super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl =
       (tuple<spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>)*plVar12;
  plVar12 = plVar12 + 1;
  if (((Node *)_Var10._M_t.
               super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
               super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->code == code)
  goto LAB_00110e4e;
  goto LAB_00110e2e;
}

Assistant:

void Graph::AddAlignment(
    const Alignment& alignment,
    const char* sequence, std::uint32_t sequence_len,
    const std::vector<std::uint32_t>& weights) {
  if (sequence_len == 0) {
    return;
  }
  if (sequence_len != weights.size()) {
    throw std::invalid_argument(
        "[spoa::Graph::AddAlignment] error: "
        "sequence and weights are of unequal size!");
  }

  for (std::uint32_t i = 0; i < sequence_len; ++i) {
    if (coder_[sequence[i]] == -1) {
      coder_[sequence[i]] = num_codes_;
      decoder_[num_codes_++] = sequence[i];
    }
  }

  if (alignment.empty()) {
    sequences_.emplace_back(AddSequence(sequence, weights, 0, sequence_len));
    TopologicalSort();
    return;
  }

  std::vector<std::uint32_t> valid;
  for (const auto& it : alignment) {
    if (it.second != -1) {
      if (it.second < 0 || it.second >= static_cast<std::int32_t>(sequence_len)) {  // NOLINT
        throw std::invalid_argument(
            "[spoa::Graph::AddAlignment] error: invalid alignment");
      }
      valid.emplace_back(it.second);
    }
  }
  if (valid.empty()) {
    throw std::invalid_argument(
        "[spoa::Graph::AddAlignment] error: missing sequence in alignment");
  }

  // add unaligned bases
  Node* begin = AddSequence(sequence, weights, 0, valid.front());
  Node* prev = begin ? nodes_.back().get() : nullptr;
  Node* last = AddSequence(sequence, weights, valid.back() + 1, sequence_len);

  // add aligned bases
  for (const auto& it : alignment) {
    if (it.second == -1) {
      continue;
    }

    std::uint32_t code = coder_[sequence[it.second]];
    Node* curr = nullptr;
    if (it.first == -1) {
      curr = AddNode(code);
    } else {
      auto jt = nodes_[it.first].get();
      if (jt->code == code) {
        curr = jt;
      } else {
        for (const auto& kt : jt->aligned_nodes) {
          if (kt->code == code) {
            curr = kt;
            break;
          }
        }
        if (!curr) {
          curr = AddNode(code);
          for (const auto& kt : jt->aligned_nodes) {
            kt->aligned_nodes.emplace_back(curr);
            curr->aligned_nodes.emplace_back(kt);
          }
          jt->aligned_nodes.emplace_back(curr);
          curr->aligned_nodes.emplace_back(jt);
        }
      }
    }
    if (!begin) {
      begin = curr;
    }
    if (prev) {  // both nodes contribute to weight
      AddEdge(prev, curr, weights[it.second - 1] + weights[it.second]);
    }
    prev = curr;
  }
  if (last) {
    AddEdge(prev, last, weights[valid.back()] + weights[valid.back() + 1]);
  }
  sequences_.emplace_back(begin);

  TopologicalSort();
}